

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ArrayFeatureType::MergePartialFromCodedStream
          (ArrayFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint64 *puVar4;
  uint8 *puVar5;
  uint32 *puVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  ArrayFeatureType_EnumeratedShapes *pAVar10;
  ArrayFeatureType_ShapeRange *this_00;
  pair<int,_int> pVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint32 local_4c;
  ArrayFeatureType_EnumeratedShapes *local_48;
  int local_3c;
  uint64 local_38;
  
  do {
    pbVar3 = input->buffer_;
    uVar9 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar14 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar9 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar9 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
        goto LAB_00458cbe;
        uVar14 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar14 = uVar14 | 0x100000000;
    }
    else {
LAB_00458cbe:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar14 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar9 | uVar14;
    }
    uVar9 = (uint32)uVar14;
    if ((uVar14 & 0x100000000) == 0) goto LAB_0045898b;
    uVar8 = (uint)(uVar14 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar14;
    if (uVar8 < 0x1f) {
      if (uVar8 == 1) {
        if (cVar12 == '\b') {
          bVar7 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,10,input,&this->shape_);
        }
        else {
          if ((uVar9 & 0xff) != 10) goto LAB_0045898b;
          bVar7 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,&this->shape_);
        }
      }
      else {
        if (uVar8 == 2) {
          if (cVar12 == '\x10') {
            pbVar3 = input->buffer_;
            if (pbVar3 < input->buffer_end_) {
              bVar2 = *pbVar3;
              uVar14 = (ulong)bVar2;
              uVar9 = (uint32)bVar2;
              if ((char)bVar2 < '\0') goto LAB_00458d4c;
              input->buffer_ = pbVar3 + 1;
              bVar7 = true;
            }
            else {
              uVar9 = 0;
LAB_00458d4c:
              uVar14 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
              bVar7 = -1 < (long)uVar14;
            }
            if (bVar7) {
              local_3c = (int)uVar14;
              this->datatype_ = local_3c;
              goto LAB_004589b5;
            }
            iVar15 = 6;
            goto LAB_004589b8;
          }
        }
        else if ((uVar8 == 0x15) && (cVar12 == -0x56)) {
          if (this->_oneof_case_[0] != 0x15) {
            clear_ShapeFlexibility(this);
            this->_oneof_case_[0] = 0x15;
            pAVar10 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
            ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(pAVar10);
            (this->ShapeFlexibility_).enumeratedshapes_ = pAVar10;
          }
          pAVar10 = (this->ShapeFlexibility_).enumeratedshapes_;
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (iVar13 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
            input->buffer_ = puVar5 + 1;
            bVar7 = true;
          }
          else {
            iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar7 = -1 < iVar13;
          }
          iVar15 = 6;
          if (bVar7) {
            local_48 = pAVar10;
            pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar13);
            if (-1 < (long)pVar11) {
              bVar7 = ArrayFeatureType_EnumeratedShapes::MergePartialFromCodedStream(local_48,input)
              ;
              goto LAB_00458c9f;
            }
            goto LAB_00458c87;
          }
          goto LAB_004589b8;
        }
LAB_0045898b:
        iVar15 = 7;
        if ((uVar9 & 7) == 4 || uVar9 == 0) goto LAB_004589b8;
        bVar7 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
      }
      if (bVar7 != false) goto LAB_004589b5;
LAB_00458d3f:
      iVar15 = 6;
    }
    else {
      if (uVar8 < 0x33) {
        if (uVar8 == 0x1f) {
          if (cVar12 != -6) goto LAB_0045898b;
          if (this->_oneof_case_[0] != 0x1f) {
            clear_ShapeFlexibility(this);
            this->_oneof_case_[0] = 0x1f;
            this_00 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
            ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(this_00);
            (this->ShapeFlexibility_).shaperange_ = this_00;
          }
          pAVar10 = (ArrayFeatureType_EnumeratedShapes *)(this->ShapeFlexibility_).shaperange_;
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (iVar13 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
            input->buffer_ = puVar5 + 1;
            bVar7 = true;
          }
          else {
            iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar7 = -1 < iVar13;
          }
          iVar15 = 6;
          if (bVar7) {
            local_48 = pAVar10;
            pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar13);
            if (-1 < (long)pVar11) {
              bVar7 = ArrayFeatureType_ShapeRange::MergePartialFromCodedStream
                                ((ArrayFeatureType_ShapeRange *)local_48,input);
LAB_00458c9f:
              iVar15 = 6;
              if (bVar7 != false) {
                bVar7 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                  (input,pVar11.first);
                if (bVar7) goto LAB_004589b5;
                goto LAB_004589b8;
              }
            }
LAB_00458c87:
            iVar15 = 6;
          }
          goto LAB_004589b8;
        }
        if ((uVar8 != 0x29) || (cVar12 != 'H')) goto LAB_0045898b;
        this->_oneof_case_[1] = 0;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar14 = (ulong)bVar2;
          uVar9 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_00458cfb;
          input->buffer_ = pbVar3 + 1;
          bVar7 = true;
        }
        else {
          uVar9 = 0;
LAB_00458cfb:
          uVar14 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar7 = -1 < (long)uVar14;
        }
        iVar15 = 6;
        if (!bVar7) goto LAB_004589b8;
        (this->defaultOptionalValue_).intdefaultvalue_ = (int32)uVar14;
        this->_oneof_case_[1] = 0x29;
      }
      else {
        if (uVar8 != 0x33) {
          if ((uVar8 != 0x3d) || (cVar12 != -0x17)) goto LAB_0045898b;
          this->_oneof_case_[1] = 0;
          puVar4 = (uint64 *)input->buffer_;
          if (7 < *(int *)&input->buffer_end_ - (int)puVar4) {
            local_38 = *puVar4;
            input->buffer_ = (uint8 *)(puVar4 + 1);
LAB_00458adc:
            *(uint64 *)&(this->defaultOptionalValue_).intdefaultvalue_ = local_38;
            this->_oneof_case_[1] = 0x3d;
            goto LAB_004589b5;
          }
          bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,&local_38);
          if (bVar7) goto LAB_00458adc;
          goto LAB_00458d3f;
        }
        if (cVar12 != -99) goto LAB_0045898b;
        this->_oneof_case_[1] = 0;
        puVar6 = (uint32 *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar6 < 4) {
          bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,&local_4c);
          if (!bVar7) goto LAB_00458d3f;
        }
        else {
          local_4c = *puVar6;
          input->buffer_ = (uint8 *)(puVar6 + 1);
        }
        *(uint32 *)&this->defaultOptionalValue_ = local_4c;
        this->_oneof_case_[1] = 0x33;
      }
LAB_004589b5:
      iVar15 = 0;
    }
LAB_004589b8:
    if (iVar15 != 0) {
      return iVar15 != 6;
    }
  } while( true );
}

Assistant:

bool ArrayFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ArrayFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 shape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_shape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_shape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_datatype(static_cast< ::CoreML::Specification::ArrayFeatureType_ArrayDataType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedshapes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shaperange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intDefaultValue = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &defaultOptionalValue_.intdefaultvalue_)));
          set_has_intdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float floatDefaultValue = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(413u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &defaultOptionalValue_.floatdefaultvalue_)));
          set_has_floatdefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double doubleDefaultValue = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(489u)) {
          clear_defaultOptionalValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &defaultOptionalValue_.doubledefaultvalue_)));
          set_has_doubledefaultvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ArrayFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ArrayFeatureType)
  return false;
#undef DO_
}